

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
insert<kj::HashMap<kj::StringPtr,unsigned_short>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table,size_t pos,
          StringPtr *params)

{
  uint uVar1;
  HashBucket *pHVar2;
  size_t sVar3;
  void *__s2;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar9;
  size_t sVar10;
  HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *this_00;
  ulong targetSize;
  uint hash;
  undefined8 *in_R9;
  ulong uVar11;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar12;
  ArrayPtr<const_unsigned_char> s_00;
  Maybe<unsigned_long> MVar13;
  
  this_00 = (HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *)table.ptr;
  uVar11 = (this_00->buckets).size_ * 2;
  if (uVar11 < (this_00->erasedCount + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar11) {
      targetSize = uVar11;
    }
    HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>::rehash(this_00,targetSize);
  }
  s_00.size_ = in_R9[1] - 1;
  s_00.ptr = (uchar *)*in_R9;
  uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s_00);
  aVar9.value._1_7_ = 0;
  aVar9.value._0_1_ = uVar5 != 0;
  hash = CONCAT31(0,uVar5 != 0);
  uVar6 = kj::_::chooseBucket(hash,(uint)(this_00->buckets).size_);
  pHVar2 = (this_00->buckets).ptr;
  sVar3 = (this_00->buckets).size_;
  __s2 = (void *)*in_R9;
  lVar4 = in_R9[1];
  paVar12 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pHVar2 + uVar6);
    uVar1 = *(uint *)((long)paVar8 + 4);
    if (uVar1 == 1) {
      if (paVar12 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar12 = paVar8;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar12 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          paVar8 = paVar12;
        }
        aVar9.value = ((ulong)(uVar5 != 0) | (long)params << 0x20) + 0x200000000;
        paVar8->value = (unsigned_long)aVar9;
        *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x0;
        goto LAB_001f3fce;
      }
      if ((*(uint *)paVar8 == (uint)aVar9.value) &&
         (uVar11 = (ulong)(uVar1 - 2), *(long *)(table.size_ + 8 + uVar11 * 0x18) == lVar4)) {
        iVar7 = bcmp(*(void **)(table.size_ + uVar11 * 0x18),__s2,lVar4 - 1);
        aVar9.value._4_4_ = 0;
        aVar9.value._0_4_ = hash;
        if (iVar7 == 0) {
          *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1;
          *(ulong *)(this + 8) = uVar11;
LAB_001f3fce:
          MVar13.ptr.field_1.value = aVar9.value;
          MVar13.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar13.ptr;
        }
      }
    }
    sVar10 = (ulong)uVar6 + 1;
    uVar6 = (uint)sVar10;
    if (sVar10 == sVar3) {
      uVar6 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }